

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall adios2::core::IO::ExitComputationBlock(IO *this)

{
  bool bVar1;
  Mode MVar2;
  reference ppVar3;
  element_type *peVar4;
  long in_RDI;
  shared_ptr<adios2::core::Engine> *engine;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>
  *enginePair;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
  *in_stack_ffffffffffffffc8;
  shared_ptr<adios2::core::Engine> *this_00;
  _Self local_20;
  _Self local_18;
  long local_10;
  
  local_10 = in_RDI + 0x188;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                          *)0x8a0d56);
    this_00 = &ppVar3->second;
    peVar4 = std::
             __shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x8a0d73);
    MVar2 = Engine::OpenMode(peVar4);
    if (MVar2 != Read) {
      peVar4 = std::
               __shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<adios2::core::Engine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x8a0d8e);
      (*peVar4->_vptr_Engine[0x14])();
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<adios2::core::Engine>_>_>
                  *)this_00);
  }
  return;
}

Assistant:

void IO::ExitComputationBlock() noexcept
{
    for (auto &enginePair : m_Engines)
    {
        auto &engine = enginePair.second;
        if (engine->OpenMode() != Mode::Read)
        {
            enginePair.second->ExitComputationBlock();
        }
    }
}